

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

void embree::avx512::OrientedDiscMiMBIntersectorK<4,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  Scene *pSVar7;
  Geometry *pGVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  byte bVar36;
  uint uVar37;
  ulong uVar38;
  uint uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined4 uVar59;
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RTCFilterFunctionNArguments local_290;
  undefined1 local_260 [32];
  undefined1 local_230 [16];
  undefined1 local_220 [32];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [2] [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [32];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  pSVar7 = context->scene;
  pGVar8 = (pSVar7->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar8->time_range).lower;
  uVar30 = (ulong)(Disc->primIDs).field_0.i[0];
  fVar1 = pGVar8->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0xe0) - fVar1) / ((pGVar8->time_range).upper - fVar1));
  auVar53 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar53 = vminss_avx(auVar53,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar41 = vmaxss_avx(ZEXT816(0) << 0x20,auVar53);
  lVar9 = *(long *)&pGVar8[2].numPrimitives;
  lVar35 = (long)(int)auVar41._0_4_ * 0x38;
  lVar10 = *(long *)(lVar9 + 0x10 + lVar35);
  lVar34 = *(long *)(lVar9 + lVar35);
  auVar53 = *(undefined1 (*) [16])(lVar34 + lVar10 * uVar30);
  uVar32 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar54 = *(undefined1 (*) [16])(lVar34 + lVar10 * uVar32);
  uVar38 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar55 = *(undefined1 (*) [16])(lVar34 + lVar10 * uVar38);
  uVar33 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar56 = *(undefined1 (*) [16])(lVar34 + lVar10 * uVar33);
  p_Var11 = pGVar8[2].intersectionFilterN;
  lVar10 = *(long *)(p_Var11 + lVar35);
  lVar34 = *(long *)(p_Var11 + lVar35 + 0x10);
  auVar58 = *(undefined1 (*) [16])(lVar10 + lVar34 * uVar30);
  auVar47 = *(undefined1 (*) [16])(lVar10 + lVar34 * uVar32);
  auVar61 = *(undefined1 (*) [16])(lVar10 + lVar34 * uVar38);
  auVar6 = *(undefined1 (*) [16])(lVar10 + lVar34 * uVar33);
  lVar34 = (long)((int)auVar41._0_4_ + 1) * 0x38;
  lVar10 = *(long *)(lVar9 + lVar34);
  lVar9 = *(long *)(lVar9 + 0x10 + lVar34);
  auVar48 = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar30);
  auVar50 = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar32);
  auVar49 = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar38);
  auVar51 = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar33);
  lVar9 = *(long *)(p_Var11 + lVar34);
  lVar10 = *(long *)(p_Var11 + lVar34 + 0x10);
  auVar52 = *(undefined1 (*) [16])(lVar9 + uVar30 * lVar10);
  auVar63 = *(undefined1 (*) [16])(lVar9 + uVar32 * lVar10);
  auVar69 = *(undefined1 (*) [16])(lVar9 + uVar38 * lVar10);
  auVar70 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar33);
  auVar40 = vsubss_avx512f(ZEXT416((uint)fVar1),auVar41);
  auVar41 = vunpcklps_avx512vl(auVar53,auVar55);
  auVar53 = vunpckhps_avx(auVar53,auVar55);
  auVar55 = vunpcklps_avx(auVar54,auVar56);
  auVar54 = vunpckhps_avx(auVar54,auVar56);
  auVar42 = vunpcklps_avx512vl(auVar41,auVar55);
  auVar43 = vunpckhps_avx512vl(auVar41,auVar55);
  auVar41 = vunpcklps_avx(auVar53,auVar54);
  auVar46 = vunpcklps_avx(auVar58,auVar61);
  auVar55 = vunpckhps_avx(auVar58,auVar61);
  auVar58 = vunpcklps_avx(auVar47,auVar6);
  auVar56 = vunpckhps_avx(auVar47,auVar6);
  auVar44 = vunpcklps_avx512vl(auVar55,auVar56);
  auVar45 = vunpcklps_avx512vl(auVar46,auVar58);
  auVar46 = vunpckhps_avx512vl(auVar46,auVar58);
  auVar58 = vunpcklps_avx(auVar48,auVar49);
  auVar55 = vunpckhps_avx(auVar48,auVar49);
  auVar47 = vunpcklps_avx(auVar50,auVar51);
  auVar56 = vunpckhps_avx(auVar50,auVar51);
  auVar61 = vunpcklps_avx(auVar58,auVar47);
  auVar58 = vunpckhps_avx(auVar58,auVar47);
  auVar6 = vunpcklps_avx(auVar55,auVar56);
  auVar47 = vunpcklps_avx512vl(auVar52,auVar69);
  auVar48 = vunpckhps_avx512vl(auVar52,auVar69);
  auVar49 = vunpcklps_avx512vl(auVar63,auVar70);
  auVar50 = vunpckhps_avx512vl(auVar63,auVar70);
  auVar48 = vunpcklps_avx(auVar48,auVar50);
  auVar50 = vunpcklps_avx(auVar47,auVar49);
  auVar47 = vunpckhps_avx(auVar47,auVar49);
  auVar49 = vbroadcastss_avx512vl(auVar40);
  auVar51 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar40);
  uVar59 = auVar51._0_4_;
  auVar69._4_4_ = uVar59;
  auVar69._0_4_ = uVar59;
  auVar69._8_4_ = uVar59;
  auVar69._12_4_ = uVar59;
  fVar65 = auVar49._0_4_;
  auVar52._0_4_ = fVar65 * auVar61._0_4_;
  fVar66 = auVar49._4_4_;
  auVar52._4_4_ = fVar66 * auVar61._4_4_;
  fVar67 = auVar49._8_4_;
  auVar52._8_4_ = fVar67 * auVar61._8_4_;
  fVar68 = auVar49._12_4_;
  auVar52._12_4_ = fVar68 * auVar61._12_4_;
  auVar61._0_4_ = fVar65 * auVar58._0_4_;
  auVar61._4_4_ = fVar66 * auVar58._4_4_;
  auVar61._8_4_ = fVar67 * auVar58._8_4_;
  auVar61._12_4_ = fVar68 * auVar58._12_4_;
  auVar63._0_4_ = fVar65 * auVar6._0_4_;
  auVar63._4_4_ = fVar66 * auVar6._4_4_;
  auVar63._8_4_ = fVar67 * auVar6._8_4_;
  auVar63._12_4_ = fVar68 * auVar6._12_4_;
  auVar58 = vfmadd231ps_fma(auVar52,auVar69,auVar42);
  auVar61 = vfmadd231ps_fma(auVar61,auVar69,auVar43);
  auVar6 = vfmadd231ps_fma(auVar63,auVar69,auVar41);
  auVar49._0_4_ = fVar65 * auVar50._0_4_;
  auVar49._4_4_ = fVar66 * auVar50._4_4_;
  auVar49._8_4_ = fVar67 * auVar50._8_4_;
  auVar49._12_4_ = fVar68 * auVar50._12_4_;
  auVar50._0_4_ = fVar65 * auVar47._0_4_;
  auVar50._4_4_ = fVar66 * auVar47._4_4_;
  auVar50._8_4_ = fVar67 * auVar47._8_4_;
  auVar50._12_4_ = fVar68 * auVar47._12_4_;
  auVar51._0_4_ = fVar65 * auVar48._0_4_;
  auVar51._4_4_ = fVar66 * auVar48._4_4_;
  auVar51._8_4_ = fVar67 * auVar48._8_4_;
  auVar51._12_4_ = fVar68 * auVar48._12_4_;
  local_1f0 = vfmadd231ps_avx512vl(auVar49,auVar69,auVar45);
  local_1e0 = vfmadd231ps_avx512vl(auVar50,auVar69,auVar46);
  auVar47 = vpbroadcastd_avx512vl();
  uVar21 = vpcmpgtd_avx512vl(auVar47,_DAT_01ff0cf0);
  local_1d0[0] = vfmadd231ps_avx512vl(auVar51,auVar69,auVar44);
  local_1b0 = vpbroadcastd_avx512vl();
  fVar1 = *(float *)(ray + k * 4);
  auVar70._4_4_ = fVar1;
  auVar70._0_4_ = fVar1;
  auVar70._8_4_ = fVar1;
  auVar70._12_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x20);
  auVar41._4_4_ = fVar2;
  auVar41._0_4_ = fVar2;
  auVar41._8_4_ = fVar2;
  auVar41._12_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x40);
  auVar46._4_4_ = fVar3;
  auVar46._0_4_ = fVar3;
  auVar46._8_4_ = fVar3;
  auVar46._12_4_ = fVar3;
  uVar59 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar40._4_4_ = uVar59;
  auVar40._0_4_ = uVar59;
  auVar40._8_4_ = uVar59;
  auVar40._12_4_ = uVar59;
  auVar50 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar49 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar47 = vmulps_avx512vl(local_1d0[0],auVar49);
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar50,local_1e0);
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar40,local_1f0);
  auVar48 = vxorps_avx512vl(auVar44,auVar44);
  uVar30 = vcmpps_avx512vl(auVar47,auVar48,0);
  auVar48 = vsubps_avx512vl(auVar58,auVar70);
  auVar51 = vsubps_avx512vl(auVar61,auVar41);
  auVar52 = vsubps_avx512vl(auVar6,auVar46);
  auVar52 = vmulps_avx512vl(local_1d0[0],auVar52);
  auVar51 = vfmadd231ps_avx512vl(auVar52,local_1e0,auVar51);
  auVar48 = vfmadd231ps_avx512vl(auVar51,local_1f0,auVar48);
  auVar47 = vdivps_avx512vl(auVar48,auVar47);
  bVar12 = (bool)((byte)uVar30 & 1);
  local_200._0_4_ = (uint)bVar12 * auVar48._0_4_ | (uint)!bVar12 * auVar47._0_4_;
  bVar12 = (bool)((byte)(uVar30 >> 1) & 1);
  local_200._4_4_ = (uint)bVar12 * auVar48._4_4_ | (uint)!bVar12 * auVar47._4_4_;
  bVar12 = (bool)((byte)(uVar30 >> 2) & 1);
  local_200._8_4_ = (uint)bVar12 * auVar48._8_4_ | (uint)!bVar12 * auVar47._8_4_;
  bVar12 = (bool)((byte)(uVar30 >> 3) & 1);
  local_200._12_4_ = (uint)bVar12 * auVar48._12_4_ | (uint)!bVar12 * auVar47._12_4_;
  auVar71 = ZEXT1664(local_200);
  uVar59 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar47._4_4_ = uVar59;
  auVar47._0_4_ = uVar59;
  auVar47._8_4_ = uVar59;
  auVar47._12_4_ = uVar59;
  uVar19 = vcmpps_avx512vl(local_200,auVar47,0xd);
  uVar59 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar48._4_4_ = uVar59;
  auVar48._0_4_ = uVar59;
  auVar48._8_4_ = uVar59;
  auVar48._12_4_ = uVar59;
  uVar20 = vcmpps_avx512vl(local_200,auVar48,2);
  bVar36 = (byte)uVar19 & (byte)uVar20 & ~(byte)uVar30 & (byte)uVar21 & 0xf;
  if (bVar36 != 0) {
    auVar53 = vunpckhps_avx(auVar53,auVar54);
    auVar54 = vunpckhps_avx(auVar55,auVar56);
    auVar55._0_4_ = fVar65 * auVar54._0_4_;
    auVar55._4_4_ = fVar66 * auVar54._4_4_;
    auVar55._8_4_ = fVar67 * auVar54._8_4_;
    auVar55._12_4_ = fVar68 * auVar54._12_4_;
    auVar56 = vfmadd231ps_fma(auVar55,auVar69,auVar53);
    auVar53 = vmulps_avx512vl(auVar40,local_200);
    auVar54 = vmulps_avx512vl(auVar50,local_200);
    auVar55 = vmulps_avx512vl(auVar49,local_200);
    auVar42._0_4_ = fVar1 + auVar53._0_4_;
    auVar42._4_4_ = fVar1 + auVar53._4_4_;
    auVar42._8_4_ = fVar1 + auVar53._8_4_;
    auVar42._12_4_ = fVar1 + auVar53._12_4_;
    auVar43._0_4_ = fVar2 + auVar54._0_4_;
    auVar43._4_4_ = fVar2 + auVar54._4_4_;
    auVar43._8_4_ = fVar2 + auVar54._8_4_;
    auVar43._12_4_ = fVar2 + auVar54._12_4_;
    auVar44._0_4_ = fVar3 + auVar55._0_4_;
    auVar44._4_4_ = fVar3 + auVar55._4_4_;
    auVar44._8_4_ = fVar3 + auVar55._8_4_;
    auVar44._12_4_ = fVar3 + auVar55._12_4_;
    auVar53 = vsubps_avx(auVar42,auVar58);
    auVar54 = vsubps_avx(auVar43,auVar61);
    auVar55 = vsubps_avx(auVar44,auVar6);
    auVar58._0_4_ = auVar55._0_4_ * auVar55._0_4_;
    auVar58._4_4_ = auVar55._4_4_ * auVar55._4_4_;
    auVar58._8_4_ = auVar55._8_4_ * auVar55._8_4_;
    auVar58._12_4_ = auVar55._12_4_ * auVar55._12_4_;
    auVar54 = vfmadd231ps_fma(auVar58,auVar54,auVar54);
    auVar53 = vfmadd231ps_fma(auVar54,auVar53,auVar53);
    auVar54._0_4_ = auVar56._0_4_ * auVar56._0_4_;
    auVar54._4_4_ = auVar56._4_4_ * auVar56._4_4_;
    auVar54._8_4_ = auVar56._8_4_ * auVar56._8_4_;
    auVar54._12_4_ = auVar56._12_4_ * auVar56._12_4_;
    uVar19 = vcmpps_avx512vl(auVar53,auVar54,1);
    bVar36 = bVar36 & (byte)uVar19;
    uVar37 = (uint)bVar36;
    if (bVar36 != 0) {
      local_220 = ZEXT432(0) << 0x20;
      auVar53._8_4_ = 0x7f800000;
      auVar53._0_8_ = 0x7f8000007f800000;
      auVar53._12_4_ = 0x7f800000;
      auVar60 = ZEXT1664(auVar53);
      auVar53 = vblendmps_avx512vl(auVar53,local_200);
      auVar56._4_4_ = (uint)(bVar36 >> 1 & 1) * auVar53._4_4_;
      auVar56._0_4_ = (uint)(bVar36 & 1) * auVar53._0_4_;
      auVar56._8_4_ = (uint)(bVar36 >> 2 & 1) * auVar53._8_4_;
      auVar56._12_4_ = (uint)(bVar36 >> 3) * auVar53._12_4_;
      auVar53 = vshufps_avx(auVar56,auVar56,0xb1);
      auVar53 = vminps_avx(auVar53,auVar56);
      auVar54 = vshufpd_avx(auVar53,auVar53,1);
      auVar53 = vminps_avx(auVar54,auVar53);
      uVar19 = vcmpps_avx512vl(auVar56,auVar53,0);
      bVar36 = (byte)uVar19 & bVar36;
      uVar31 = uVar37;
      if (bVar36 != 0) {
        uVar31 = (uint)bVar36;
      }
      uVar29 = 0;
      for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x80000000) {
        uVar29 = uVar29 + 1;
      }
      auVar57 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
      auVar62 = ZEXT3264(auVar57);
      auVar57 = vpcmpeqd_avx2(ZEXT1632(auVar6),ZEXT1632(auVar6));
      auVar64 = ZEXT3264(auVar57);
      do {
        local_290.valid = (int *)local_260;
        local_230 = auVar71._0_16_;
        uVar39 = uVar29 & 0xff;
        uVar31 = *(uint *)(local_1b0 + (ulong)uVar39 * 4);
        pGVar8 = (pSVar7->geometries).items[uVar31].ptr;
        if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          bVar36 = ~(byte)(1 << (uVar29 & 0x1f)) & (byte)uVar37;
LAB_01bd679c:
          uVar37 = (uint)bVar36;
          bVar12 = true;
        }
        else {
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
            uVar30 = (ulong)(uVar39 * 4);
            local_120 = *(undefined4 *)(local_220 + uVar30);
            local_100 = *(undefined4 *)(local_220 + uVar30 + 0x10);
            local_c0 = vpbroadcastd_avx512vl();
            uVar59 = *(undefined4 *)((long)&(Disc->primIDs).field_0 + uVar30);
            local_e0._4_4_ = uVar59;
            local_e0._0_4_ = uVar59;
            local_e0._8_4_ = uVar59;
            local_e0._12_4_ = uVar59;
            local_e0._16_4_ = uVar59;
            local_e0._20_4_ = uVar59;
            local_e0._24_4_ = uVar59;
            local_e0._28_4_ = uVar59;
            uVar59 = *(undefined4 *)(local_1f0 + uVar30);
            uVar5 = *(undefined4 *)(local_1e0 + uVar30);
            local_160._4_4_ = uVar5;
            local_160._0_4_ = uVar5;
            local_160._8_4_ = uVar5;
            local_160._12_4_ = uVar5;
            local_160._16_4_ = uVar5;
            local_160._20_4_ = uVar5;
            local_160._24_4_ = uVar5;
            local_160._28_4_ = uVar5;
            uVar5 = *(undefined4 *)(local_1d0[0] + uVar30);
            local_140._4_4_ = uVar5;
            local_140._0_4_ = uVar5;
            local_140._8_4_ = uVar5;
            local_140._12_4_ = uVar5;
            local_140._16_4_ = uVar5;
            local_140._20_4_ = uVar5;
            local_140._24_4_ = uVar5;
            local_140._28_4_ = uVar5;
            local_180[0] = (RTCHitN)(char)uVar59;
            local_180[1] = (RTCHitN)(char)((uint)uVar59 >> 8);
            local_180[2] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
            local_180[3] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
            local_180[4] = (RTCHitN)(char)uVar59;
            local_180[5] = (RTCHitN)(char)((uint)uVar59 >> 8);
            local_180[6] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
            local_180[7] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
            local_180[8] = (RTCHitN)(char)uVar59;
            local_180[9] = (RTCHitN)(char)((uint)uVar59 >> 8);
            local_180[10] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
            local_180[0xb] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
            local_180[0xc] = (RTCHitN)(char)uVar59;
            local_180[0xd] = (RTCHitN)(char)((uint)uVar59 >> 8);
            local_180[0xe] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
            local_180[0xf] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
            local_180[0x10] = (RTCHitN)(char)uVar59;
            local_180[0x11] = (RTCHitN)(char)((uint)uVar59 >> 8);
            local_180[0x12] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
            local_180[0x13] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
            local_180[0x14] = (RTCHitN)(char)uVar59;
            local_180[0x15] = (RTCHitN)(char)((uint)uVar59 >> 8);
            local_180[0x16] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
            local_180[0x17] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
            local_180[0x18] = (RTCHitN)(char)uVar59;
            local_180[0x19] = (RTCHitN)(char)((uint)uVar59 >> 8);
            local_180[0x1a] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
            local_180[0x1b] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
            local_180[0x1c] = (RTCHitN)(char)uVar59;
            local_180[0x1d] = (RTCHitN)(char)((uint)uVar59 >> 8);
            local_180[0x1e] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
            local_180[0x1f] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
            uStack_11c = local_120;
            uStack_118 = local_120;
            uStack_114 = local_120;
            uStack_110 = local_120;
            uStack_10c = local_120;
            uStack_108 = local_120;
            uStack_104 = local_120;
            uStack_fc = local_100;
            uStack_f8 = local_100;
            uStack_f4 = local_100;
            uStack_f0 = local_100;
            uStack_ec = local_100;
            uStack_e8 = local_100;
            uStack_e4 = local_100;
            uStack_9c = context->user->instID[0];
            local_a0 = uStack_9c;
            uStack_98 = uStack_9c;
            uStack_94 = uStack_9c;
            uStack_90 = uStack_9c;
            uStack_8c = uStack_9c;
            uStack_88 = uStack_9c;
            uStack_84 = uStack_9c;
            uStack_7c = context->user->instPrimID[0];
            local_80 = uStack_7c;
            uStack_78 = uStack_7c;
            uStack_74 = uStack_7c;
            uStack_70 = uStack_7c;
            uStack_6c = uStack_7c;
            uStack_68 = uStack_7c;
            uStack_64 = uStack_7c;
            uVar4 = *(uint *)(ray + k * 4 + 0x100);
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_200 + uVar30);
            local_260 = auVar62._0_32_;
            local_290.geometryUserPtr = pGVar8->userPtr;
            local_290.context = context->user;
            local_290.hit = local_180;
            local_290.N = 8;
            local_1a0 = local_260;
            local_290.ray = (RTCRayN *)ray;
            if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              auVar57 = ZEXT1632(auVar64._0_16_);
              (*pGVar8->intersectionFilterN)(&local_290);
              auVar57 = vpcmpeqd_avx2(auVar57,auVar57);
              auVar64 = ZEXT3264(auVar57);
              auVar62 = ZEXT3264(local_1a0);
              auVar60 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar71 = ZEXT1664(local_230);
            }
            if (local_260 == (undefined1  [32])0x0) {
LAB_01bd6a87:
              auVar56 = ZEXT416(uVar4);
              *(uint *)(ray + k * 4 + 0x100) = uVar4;
            }
            else {
              p_Var11 = context->args->filter;
              if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                auVar57 = ZEXT1632(auVar64._0_16_);
                (*p_Var11)(&local_290);
                auVar57 = vpcmpeqd_avx2(auVar57,auVar57);
                auVar64 = ZEXT3264(auVar57);
                auVar62 = ZEXT3264(local_1a0);
                auVar60 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar71 = ZEXT1664(local_230);
              }
              if (local_260 == (undefined1  [32])0x0) goto LAB_01bd6a87;
              uVar30 = vptestmd_avx512vl(local_260,local_260);
              iVar22 = *(int *)(local_290.hit + 4);
              iVar23 = *(int *)(local_290.hit + 8);
              iVar24 = *(int *)(local_290.hit + 0xc);
              iVar25 = *(int *)(local_290.hit + 0x10);
              iVar26 = *(int *)(local_290.hit + 0x14);
              iVar27 = *(int *)(local_290.hit + 0x18);
              iVar28 = *(int *)(local_290.hit + 0x1c);
              bVar36 = (byte)uVar30;
              bVar12 = (bool)((byte)(uVar30 >> 1) & 1);
              bVar13 = (bool)((byte)(uVar30 >> 2) & 1);
              bVar14 = (bool)((byte)(uVar30 >> 3) & 1);
              bVar15 = (bool)((byte)(uVar30 >> 4) & 1);
              bVar16 = (bool)((byte)(uVar30 >> 5) & 1);
              bVar17 = (bool)((byte)(uVar30 >> 6) & 1);
              bVar18 = SUB81(uVar30 >> 7,0);
              *(uint *)(local_290.ray + 0x180) =
                   (uint)(bVar36 & 1) * *(int *)local_290.hit |
                   (uint)!(bool)(bVar36 & 1) * *(int *)(local_290.ray + 0x180);
              *(uint *)(local_290.ray + 0x184) =
                   (uint)bVar12 * iVar22 | (uint)!bVar12 * *(int *)(local_290.ray + 0x184);
              *(uint *)(local_290.ray + 0x188) =
                   (uint)bVar13 * iVar23 | (uint)!bVar13 * *(int *)(local_290.ray + 0x188);
              *(uint *)(local_290.ray + 0x18c) =
                   (uint)bVar14 * iVar24 | (uint)!bVar14 * *(int *)(local_290.ray + 0x18c);
              *(uint *)(local_290.ray + 400) =
                   (uint)bVar15 * iVar25 | (uint)!bVar15 * *(int *)(local_290.ray + 400);
              *(uint *)(local_290.ray + 0x194) =
                   (uint)bVar16 * iVar26 | (uint)!bVar16 * *(int *)(local_290.ray + 0x194);
              *(uint *)(local_290.ray + 0x198) =
                   (uint)bVar17 * iVar27 | (uint)!bVar17 * *(int *)(local_290.ray + 0x198);
              *(uint *)(local_290.ray + 0x19c) =
                   (uint)bVar18 * iVar28 | (uint)!bVar18 * *(int *)(local_290.ray + 0x19c);
              iVar22 = *(int *)(local_290.hit + 0x24);
              iVar23 = *(int *)(local_290.hit + 0x28);
              iVar24 = *(int *)(local_290.hit + 0x2c);
              iVar25 = *(int *)(local_290.hit + 0x30);
              iVar26 = *(int *)(local_290.hit + 0x34);
              iVar27 = *(int *)(local_290.hit + 0x38);
              iVar28 = *(int *)(local_290.hit + 0x3c);
              bVar12 = (bool)((byte)(uVar30 >> 1) & 1);
              bVar13 = (bool)((byte)(uVar30 >> 2) & 1);
              bVar14 = (bool)((byte)(uVar30 >> 3) & 1);
              bVar15 = (bool)((byte)(uVar30 >> 4) & 1);
              bVar16 = (bool)((byte)(uVar30 >> 5) & 1);
              bVar17 = (bool)((byte)(uVar30 >> 6) & 1);
              bVar18 = SUB81(uVar30 >> 7,0);
              *(uint *)(local_290.ray + 0x1a0) =
                   (uint)(bVar36 & 1) * *(int *)(local_290.hit + 0x20) |
                   (uint)!(bool)(bVar36 & 1) * *(int *)(local_290.ray + 0x1a0);
              *(uint *)(local_290.ray + 0x1a4) =
                   (uint)bVar12 * iVar22 | (uint)!bVar12 * *(int *)(local_290.ray + 0x1a4);
              *(uint *)(local_290.ray + 0x1a8) =
                   (uint)bVar13 * iVar23 | (uint)!bVar13 * *(int *)(local_290.ray + 0x1a8);
              *(uint *)(local_290.ray + 0x1ac) =
                   (uint)bVar14 * iVar24 | (uint)!bVar14 * *(int *)(local_290.ray + 0x1ac);
              *(uint *)(local_290.ray + 0x1b0) =
                   (uint)bVar15 * iVar25 | (uint)!bVar15 * *(int *)(local_290.ray + 0x1b0);
              *(uint *)(local_290.ray + 0x1b4) =
                   (uint)bVar16 * iVar26 | (uint)!bVar16 * *(int *)(local_290.ray + 0x1b4);
              *(uint *)(local_290.ray + 0x1b8) =
                   (uint)bVar17 * iVar27 | (uint)!bVar17 * *(int *)(local_290.ray + 0x1b8);
              *(uint *)(local_290.ray + 0x1bc) =
                   (uint)bVar18 * iVar28 | (uint)!bVar18 * *(int *)(local_290.ray + 0x1bc);
              iVar22 = *(int *)(local_290.hit + 0x44);
              iVar23 = *(int *)(local_290.hit + 0x48);
              iVar24 = *(int *)(local_290.hit + 0x4c);
              iVar25 = *(int *)(local_290.hit + 0x50);
              iVar26 = *(int *)(local_290.hit + 0x54);
              iVar27 = *(int *)(local_290.hit + 0x58);
              iVar28 = *(int *)(local_290.hit + 0x5c);
              bVar12 = (bool)((byte)(uVar30 >> 1) & 1);
              bVar13 = (bool)((byte)(uVar30 >> 2) & 1);
              bVar14 = (bool)((byte)(uVar30 >> 3) & 1);
              bVar15 = (bool)((byte)(uVar30 >> 4) & 1);
              bVar16 = (bool)((byte)(uVar30 >> 5) & 1);
              bVar17 = (bool)((byte)(uVar30 >> 6) & 1);
              bVar18 = SUB81(uVar30 >> 7,0);
              *(uint *)(local_290.ray + 0x1c0) =
                   (uint)(bVar36 & 1) * *(int *)(local_290.hit + 0x40) |
                   (uint)!(bool)(bVar36 & 1) * *(int *)(local_290.ray + 0x1c0);
              *(uint *)(local_290.ray + 0x1c4) =
                   (uint)bVar12 * iVar22 | (uint)!bVar12 * *(int *)(local_290.ray + 0x1c4);
              *(uint *)(local_290.ray + 0x1c8) =
                   (uint)bVar13 * iVar23 | (uint)!bVar13 * *(int *)(local_290.ray + 0x1c8);
              *(uint *)(local_290.ray + 0x1cc) =
                   (uint)bVar14 * iVar24 | (uint)!bVar14 * *(int *)(local_290.ray + 0x1cc);
              *(uint *)(local_290.ray + 0x1d0) =
                   (uint)bVar15 * iVar25 | (uint)!bVar15 * *(int *)(local_290.ray + 0x1d0);
              *(uint *)(local_290.ray + 0x1d4) =
                   (uint)bVar16 * iVar26 | (uint)!bVar16 * *(int *)(local_290.ray + 0x1d4);
              *(uint *)(local_290.ray + 0x1d8) =
                   (uint)bVar17 * iVar27 | (uint)!bVar17 * *(int *)(local_290.ray + 0x1d8);
              *(uint *)(local_290.ray + 0x1dc) =
                   (uint)bVar18 * iVar28 | (uint)!bVar18 * *(int *)(local_290.ray + 0x1dc);
              iVar22 = *(int *)(local_290.hit + 100);
              iVar23 = *(int *)(local_290.hit + 0x68);
              iVar24 = *(int *)(local_290.hit + 0x6c);
              iVar25 = *(int *)(local_290.hit + 0x70);
              iVar26 = *(int *)(local_290.hit + 0x74);
              iVar27 = *(int *)(local_290.hit + 0x78);
              iVar28 = *(int *)(local_290.hit + 0x7c);
              bVar12 = (bool)((byte)(uVar30 >> 1) & 1);
              bVar13 = (bool)((byte)(uVar30 >> 2) & 1);
              bVar14 = (bool)((byte)(uVar30 >> 3) & 1);
              bVar15 = (bool)((byte)(uVar30 >> 4) & 1);
              bVar16 = (bool)((byte)(uVar30 >> 5) & 1);
              bVar17 = (bool)((byte)(uVar30 >> 6) & 1);
              bVar18 = SUB81(uVar30 >> 7,0);
              *(uint *)(local_290.ray + 0x1e0) =
                   (uint)(bVar36 & 1) * *(int *)(local_290.hit + 0x60) |
                   (uint)!(bool)(bVar36 & 1) * *(int *)(local_290.ray + 0x1e0);
              *(uint *)(local_290.ray + 0x1e4) =
                   (uint)bVar12 * iVar22 | (uint)!bVar12 * *(int *)(local_290.ray + 0x1e4);
              *(uint *)(local_290.ray + 0x1e8) =
                   (uint)bVar13 * iVar23 | (uint)!bVar13 * *(int *)(local_290.ray + 0x1e8);
              *(uint *)(local_290.ray + 0x1ec) =
                   (uint)bVar14 * iVar24 | (uint)!bVar14 * *(int *)(local_290.ray + 0x1ec);
              *(uint *)(local_290.ray + 0x1f0) =
                   (uint)bVar15 * iVar25 | (uint)!bVar15 * *(int *)(local_290.ray + 0x1f0);
              *(uint *)(local_290.ray + 500) =
                   (uint)bVar16 * iVar26 | (uint)!bVar16 * *(int *)(local_290.ray + 500);
              *(uint *)(local_290.ray + 0x1f8) =
                   (uint)bVar17 * iVar27 | (uint)!bVar17 * *(int *)(local_290.ray + 0x1f8);
              *(uint *)(local_290.ray + 0x1fc) =
                   (uint)bVar18 * iVar28 | (uint)!bVar18 * *(int *)(local_290.ray + 0x1fc);
              auVar57._0_4_ =
                   (uint)(bVar36 & 1) * *(int *)(local_290.hit + 0x80) |
                   (uint)!(bool)(bVar36 & 1) * *(int *)(local_290.ray + 0x200);
              bVar12 = (bool)((byte)(uVar30 >> 1) & 1);
              auVar57._4_4_ =
                   (uint)bVar12 * *(int *)(local_290.hit + 0x84) |
                   (uint)!bVar12 * *(int *)(local_290.ray + 0x204);
              bVar12 = (bool)((byte)(uVar30 >> 2) & 1);
              auVar57._8_4_ =
                   (uint)bVar12 * *(int *)(local_290.hit + 0x88) |
                   (uint)!bVar12 * *(int *)(local_290.ray + 0x208);
              bVar12 = (bool)((byte)(uVar30 >> 3) & 1);
              auVar57._12_4_ =
                   (uint)bVar12 * *(int *)(local_290.hit + 0x8c) |
                   (uint)!bVar12 * *(int *)(local_290.ray + 0x20c);
              bVar12 = (bool)((byte)(uVar30 >> 4) & 1);
              auVar57._16_4_ =
                   (uint)bVar12 * *(int *)(local_290.hit + 0x90) |
                   (uint)!bVar12 * *(int *)(local_290.ray + 0x210);
              bVar12 = (bool)((byte)(uVar30 >> 5) & 1);
              auVar57._20_4_ =
                   (uint)bVar12 * *(int *)(local_290.hit + 0x94) |
                   (uint)!bVar12 * *(int *)(local_290.ray + 0x214);
              bVar12 = (bool)((byte)(uVar30 >> 6) & 1);
              auVar57._24_4_ =
                   (uint)bVar12 * *(int *)(local_290.hit + 0x98) |
                   (uint)!bVar12 * *(int *)(local_290.ray + 0x218);
              bVar12 = SUB81(uVar30 >> 7,0);
              auVar57._28_4_ =
                   (uint)bVar12 * *(int *)(local_290.hit + 0x9c) |
                   (uint)!bVar12 * *(int *)(local_290.ray + 0x21c);
              *(undefined1 (*) [32])(local_290.ray + 0x200) = auVar57;
              auVar57 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_290.hit + 0xa0));
              *(undefined1 (*) [32])(local_290.ray + 0x220) = auVar57;
              auVar57 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_290.hit + 0xc0));
              *(undefined1 (*) [32])(local_290.ray + 0x240) = auVar57;
              auVar57 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_290.hit + 0xe0));
              *(undefined1 (*) [32])(local_290.ray + 0x260) = auVar57;
              auVar56 = SUB3216(*(undefined1 (*) [32])(local_290.hit + 0x100),0);
              auVar57 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_290.hit + 0x100));
              *(undefined1 (*) [32])(local_290.ray + 0x280) = auVar57;
            }
            uVar59 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar6._4_4_ = uVar59;
            auVar6._0_4_ = uVar59;
            auVar6._8_4_ = uVar59;
            auVar6._12_4_ = uVar59;
            uVar19 = vcmpps_avx512vl(auVar71._0_16_,auVar6,2);
            bVar36 = ~(byte)(1 << (uVar29 & 0x1f)) & (byte)uVar37 & (byte)uVar19;
            goto LAB_01bd679c;
          }
          bVar12 = false;
        }
        if (!bVar12) {
          uVar30 = (ulong)(uVar39 << 2);
          uVar59 = *(undefined4 *)(local_220 + uVar30);
          uVar5 = *(undefined4 *)(local_220 + uVar30 + 0x10);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_200 + uVar30);
          *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_1f0 + uVar30);
          *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_1e0 + uVar30);
          *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_1d0[0] + uVar30);
          *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar59;
          *(undefined4 *)(ray + k * 4 + 0x200) = uVar5;
          *(undefined4 *)(ray + k * 4 + 0x220) =
               *(undefined4 *)((long)&(Disc->primIDs).field_0 + uVar30);
          *(uint *)(ray + k * 4 + 0x240) = uVar31;
          *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
          *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
          return;
        }
        bVar36 = (byte)uVar37;
        if (bVar36 == 0) {
          return;
        }
        auVar53 = vblendmps_avx512vl(auVar60._0_16_,auVar71._0_16_);
        auVar45._0_4_ =
             (uint)(bVar36 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar36 & 1) * auVar56._0_4_;
        bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
        auVar45._4_4_ = (uint)bVar12 * auVar53._4_4_ | (uint)!bVar12 * auVar56._4_4_;
        bVar12 = (bool)((byte)(uVar37 >> 2) & 1);
        auVar45._8_4_ = (uint)bVar12 * auVar53._8_4_ | (uint)!bVar12 * auVar56._8_4_;
        auVar45._12_4_ =
             (uVar37 >> 3) * auVar53._12_4_ | (uint)!SUB41(uVar37 >> 3,0) * auVar56._12_4_;
        auVar53 = vshufps_avx(auVar45,auVar45,0xb1);
        auVar53 = vminps_avx(auVar53,auVar45);
        auVar54 = vshufpd_avx(auVar53,auVar53,1);
        auVar53 = vminps_avx(auVar54,auVar53);
        uVar19 = vcmpps_avx512vl(auVar45,auVar53,0);
        bVar36 = (byte)uVar19 & bVar36;
        uVar31 = uVar37;
        if (bVar36 != 0) {
          uVar31 = (uint)bVar36;
        }
        uVar29 = 0;
        for (; auVar56 = auVar45, (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x80000000) {
          uVar29 = uVar29 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }